

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.cpp
# Opt level: O2

string * FIX::HttpMessage::createResponse(string *__return_storage_ptr__,int error,string *text)

{
  ostream *poVar1;
  string errorString;
  stringstream response;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [16];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  local_1c8 = local_1b8;
  local_1c0 = 0;
  local_1b8[0] = 0;
  switch(error) {
  case 400:
    break;
  case 0x191:
    break;
  case 0x192:
    break;
  case 0x193:
    break;
  case 0x194:
    break;
  case 0x195:
    break;
  case 0x196:
    break;
  case 0x197:
    break;
  case 0x198:
    break;
  case 0x199:
    break;
  case 0x19a:
    break;
  case 0x19b:
    break;
  case 0x19c:
    break;
  case 0x19d:
    break;
  case 0x19e:
    break;
  case 0x19f:
    break;
  case 0x1a0:
    break;
  case 0x1a1:
    break;
  default:
    switch(error) {
    case 200:
      break;
    case 0xc9:
      break;
    case 0xca:
      break;
    case 0xcb:
      break;
    case 0xcc:
      break;
    case 0xcd:
      break;
    case 0xce:
      break;
    default:
      switch(error) {
      case 300:
        break;
      case 0x12d:
        break;
      case 0x12e:
        break;
      case 0x12f:
        break;
      case 0x130:
        break;
      case 0x131:
        break;
      case 0x132:
switchD_0019285c_caseD_132:
        break;
      case 0x133:
        break;
      default:
        switch(error) {
        case 500:
          break;
        case 0x1f5:
          break;
        case 0x1f6:
          break;
        case 0x1f7:
          break;
        case 0x1f8:
          break;
        case 0x1f9:
          break;
        default:
          if ((error == 0x65) || (error == 100)) break;
          goto switchD_0019285c_caseD_132;
        }
      }
    }
  }
  std::__cxx11::string::assign((char *)&local_1c8);
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"HTTP/1.1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,error);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  poVar1 = std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(poVar1,"Server: QuickFIX");
  poVar1 = std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(poVar1,"Content-Type: text/html; charset=iso-8859-1");
  poVar1 = std::operator<<(poVar1,"\r\n\r\n");
  std::operator<<(poVar1,"<!DOCTYPE HTML PUBLIC \"-//IETF//DTD HTML 2.0//EN\">");
  if (error - 300U < 0xffffff9c) {
    poVar1 = std::operator<<(local_198,"<HTML><HEAD><TITLE>");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,error);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
    poVar1 = std::operator<<(poVar1,"</TITLE></HEAD><BODY>");
    poVar1 = std::operator<<(poVar1,"<H1>");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,error);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
    poVar1 = std::operator<<(poVar1,"</H1>");
    poVar1 = std::operator<<(poVar1,(string *)text);
    std::operator<<(poVar1,"</BODY></HTML>");
  }
  else {
    std::operator<<(local_198,(string *)text);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string HttpMessage::createResponse(int error, const std::string &text) {
  std::string errorString;
  switch (error) {
  case 100:
    errorString = "Continue";
    break;
  case 101:
    errorString = "Switching Protocols";
    break;
  case 200:
    errorString = "OK";
    break;
  case 201:
    errorString = "Created";
    break;
  case 202:
    errorString = "Accepted";
    break;
  case 203:
    errorString = "Non-Authoritative Information";
    break;
  case 204:
    errorString = "No Content";
    break;
  case 205:
    errorString = "Reset Content";
    break;
  case 206:
    errorString = "Partial Content";
    break;
  case 300:
    errorString = "Multiple Choices";
    break;
  case 301:
    errorString = "Moved Permanently";
    break;
  case 302:
    errorString = "Found";
    break;
  case 303:
    errorString = "See Other";
    break;
  case 304:
    errorString = "Not Modified";
    break;
  case 305:
    errorString = "Use Proxy";
    break;
  case 307:
    errorString = "Temporary Redirect";
    break;
  case 400:
    errorString = "Bad Request";
    break;
  case 401:
    errorString = "Unauthorized";
    break;
  case 402:
    errorString = "Payment Required";
    break;
  case 403:
    errorString = "Forbidden";
    break;
  case 404:
    errorString = "Not Found";
    break;
  case 405:
    errorString = "Method Not Allowed";
    break;
  case 406:
    errorString = "Not Acceptable";
    break;
  case 407:
    errorString = "Proxy Authentication Required";
    break;
  case 408:
    errorString = "Request Timeout";
    break;
  case 409:
    errorString = "Conflict";
    break;
  case 410:
    errorString = "Gone";
    break;
  case 411:
    errorString = "Length Required";
    break;
  case 412:
    errorString = "Precondition Failed";
    break;
  case 413:
    errorString = "Request Entity Too Large";
    break;
  case 414:
    errorString = "Request-URI Too Large";
    break;
  case 415:
    errorString = "Unsupported Media Type";
    break;
  case 416:
    errorString = "Requested Range Not Satisfiable";
    break;
  case 417:
    errorString = "Expectation Failed";
    break;
  case 500:
    errorString = "Internal Server Error";
    break;
  case 501:
    errorString = "Not Implemented";
    break;
  case 502:
    errorString = "Bad Gateway";
    break;
  case 503:
    errorString = "Service Unavailable";
    break;
  case 504:
    errorString = "Gateway Timeout";
    break;
  case 505:
    errorString = "HTTP Version not supported";
    break;
  default:
    errorString = "Unknown";
  }

  std::stringstream response;
  response << "HTTP/1.1 " << error << " " << errorString << "\r\n"
           << "Server: QuickFIX" << "\r\n"
           << "Content-Type: text/html; charset=iso-8859-1" << "\r\n\r\n"
           << "<!DOCTYPE HTML PUBLIC \"-//IETF//DTD HTML 2.0//EN\">";

  if (error < 200 || error >= 300) {
    response << "<HTML><HEAD><TITLE>" << error << " " << errorString << "</TITLE></HEAD><BODY>"
             << "<H1>" << error << " " << errorString << "</H1>" << text << "</BODY></HTML>";
  } else {
    response << text;
  }

  return response.str();
}